

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManFromIfLogicCreateLut
              (Gia_Man_t *pNew,word *pRes,Vec_Int_t *vLeaves,Vec_Int_t *vCover,Vec_Int_t *vMapping,
              Vec_Int_t *vMapping2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iObjLit1;
  int iLit;
  int i;
  Vec_Int_t *vMapping2_local;
  Vec_Int_t *vMapping_local;
  Vec_Int_t *vCover_local;
  Vec_Int_t *vLeaves_local;
  word *pRes_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Vec_IntSize(vLeaves);
  iVar1 = Kit_TruthToGia(pNew,(uint *)pRes,iVar1,vCover,vLeaves,0);
  iVar2 = Abc_Lit2Var(iVar1);
  if (iVar2 != 0) {
    for (iObjLit1 = 0; iVar2 = Vec_IntSize(vLeaves), iObjLit1 < iVar2; iObjLit1 = iObjLit1 + 1) {
      iVar2 = Vec_IntEntry(vLeaves,iObjLit1);
      iVar3 = Abc_Lit2Var(iVar1);
      iVar2 = Abc_Lit2Var(iVar2);
      if (iVar3 == iVar2) {
        return iVar1;
      }
    }
    iVar2 = Abc_Lit2Var(iVar1);
    iVar3 = Vec_IntSize(vMapping2);
    Vec_IntSetEntry(vMapping,iVar2,iVar3);
    iVar2 = Vec_IntSize(vLeaves);
    Vec_IntPush(vMapping2,iVar2);
    for (iObjLit1 = 0; iVar2 = Vec_IntSize(vLeaves), iObjLit1 < iVar2; iObjLit1 = iObjLit1 + 1) {
      iVar2 = Vec_IntEntry(vLeaves,iObjLit1);
      iVar2 = Abc_Lit2Var(iVar2);
      Vec_IntPush(vMapping2,iVar2);
    }
    iVar2 = Abc_Lit2Var(iVar1);
    Vec_IntPush(vMapping2,iVar2);
  }
  return iVar1;
}

Assistant:

int Gia_ManFromIfLogicCreateLut( Gia_Man_t * pNew, word * pRes, Vec_Int_t * vLeaves, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    int i, iLit, iObjLit1;
    iObjLit1 = Kit_TruthToGia( pNew, (unsigned *)pRes, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
    // do not create LUT in the simple case
    if ( Abc_Lit2Var(iObjLit1) == 0 )
        return iObjLit1;
    Vec_IntForEachEntry( vLeaves, iLit, i )
        if ( Abc_Lit2Var(iObjLit1) == Abc_Lit2Var(iLit) )
            return iObjLit1;
    // write mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(iObjLit1), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
//    Vec_IntForEachEntry( vLeaves, iLit, i )
//        assert( Abc_Lit2Var(iLit) < Abc_Lit2Var(iObjLit1) );
    Vec_IntForEachEntry( vLeaves, iLit, i )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLit)  );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iObjLit1) );
    return iObjLit1;
}